

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O1

bool __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::operator==
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  uVar3 = other->_size;
  uVar5 = uVar3 - 0x11;
  if (uVar3 < 0x11) {
    uVar5 = uVar3;
  }
  uVar4 = this->_size;
  uVar6 = uVar4 - 0x11;
  if (uVar4 < 0x11) {
    uVar6 = uVar4;
  }
  if (uVar5 == uVar6) {
    if (0x10 < uVar4) {
      this = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
             (this->_union).indirect_contents.indirect;
    }
    bVar8 = uVar6 == 0;
    if (!bVar8) {
      if (0x10 < uVar3) {
        other = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                (other->_union).indirect_contents.indirect;
      }
      if ((this->_union).direct[0] == (other->_union).direct[0]) {
        lVar7 = 1;
        do {
          bVar8 = (int)uVar6 == lVar7;
          if (bVar8) break;
          pcVar1 = (this->_union).direct + lVar7;
          pcVar2 = (other->_union).direct + lVar7;
          lVar7 = lVar7 + 1;
        } while (*pcVar1 == *pcVar2);
      }
    }
  }
  else {
    bVar8 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool operator==(const prevector<N, T, Size, Diff>& other) const {
        if (other.size() != size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) != (*b2)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return true;
    }